

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  in_addr prefix;
  char cVar1;
  bool bVar2;
  bool bVar3;
  uchar prefix_len;
  int iVar4;
  uint uVar5;
  command_result_status cVar6;
  int iVar7;
  long lVar8;
  reference pvVar9;
  node<loc_rib_data> *pnVar10;
  size_type sVar11;
  undefined1 *puVar12;
  long lVar13;
  reference this;
  bgp_client_peer *peer;
  ulong uVar14;
  long lVar15;
  bgp_client_peer *peer_00;
  pointer pbVar16;
  char *format;
  pointer pbVar17;
  int i;
  allocator<char> local_505;
  in_addr address;
  json conf_json;
  iterator __begin13;
  value_type neighbor;
  iterator __end13;
  undefined1 local_478 [32];
  uint32_t uStack_458;
  sa_family_t local_454;
  in_port_t iStack_452;
  in_addr local_450;
  uint32_t local_44c;
  uint32_t uStack_448;
  ulong auStack_444 [26];
  in_addr_t local_374;
  undefined8 local_370;
  sigaction local_368;
  ifstream conf_file;
  sigaction old_act;
  
  lVar8 = std::chrono::_V2::system_clock::now();
  local_368.__sigaction_handler.sa_handler = signal_handler;
  sigemptyset(&local_368.sa_mask);
  local_368.sa_flags = 0x20000000;
  iVar4 = sigaction(0xe,&local_368,(sigaction *)&old_act);
  if (iVar4 < 0) {
    fwrite("Error registering signal disposition\n",0x25,1,_stderr);
  }
  else {
    log_id = '\0';
    log<>(INFO,"Hello BGP!!");
    fcntl(0,4,0x800);
    std::ifstream::ifstream(&conf_file,"../config.json",_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      log<>(ERROR,"Failed to open config");
    }
    else {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&conf_json,(nullptr_t)0x0);
      nlohmann::operator>>((istream *)&conf_file,&conf_json);
      std::ifstream::close();
      log<>(INFO,"Succeed to load config");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_478,"my_as",(allocator<char> *)&__begin13);
      pvVar9 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(&conf_json,(key_type *)local_478);
      my_as = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::get_impl<int,_0>(pvVar9);
      std::__cxx11::string::~string((string *)local_478);
      log<unsigned_int>(INFO,"My AS: %d",&my_as);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__begin13,"router-id",(allocator<char> *)&__end13);
      pvVar9 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(&conf_json,(key_type *)&__begin13);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (local_478,pvVar9);
      router_id = inet_addr((char *)local_478._0_8_);
      std::__cxx11::string::~string((string *)local_478);
      std::__cxx11::string::~string((string *)&__begin13);
      local_478._0_8_ = inet_ntoa((in_addr)router_id);
      log<char*>(INFO,"Router-ID: %s",(char **)local_478);
      pnVar10 = (node<loc_rib_data> *)malloc(0x30);
      bgp_loc_rib = pnVar10;
      if (pnVar10 != (node<loc_rib_data> *)0x0) {
        uVar14 = 0;
        pnVar10->is_prefix = false;
        pnVar10->prefix = 0;
        pnVar10->prefix_len = '\0';
        pnVar10->data = (loc_rib_data *)0x0;
        pnVar10->parent = (node<loc_rib_data> *)0x0;
        pnVar10->node_0 = (node<loc_rib_data> *)0x0;
        pnVar10->node_1 = (node<loc_rib_data> *)0x0;
        while( true ) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_478,"neighbors",(allocator<char> *)&__begin13);
          pvVar9 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::at(&conf_json,(key_type *)local_478);
          sVar11 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::size(pvVar9);
          std::__cxx11::string::~string((string *)local_478);
          if (sVar11 <= uVar14) break;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_478,"neighbors",(allocator<char> *)&__begin13);
          pvVar9 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::at(&conf_json,(key_type *)local_478);
          pvVar9 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator[](pvVar9,uVar14);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json(&neighbor,pvVar9);
          std::__cxx11::string::~string((string *)local_478);
          local_478[9] = '\0';
          local_478[10] = false;
          local_478._16_8_ = (undefined1 *)0x0;
          local_478._24_8_ = 0;
          local_478._0_8_ = &PTR_send_0011cd98;
          uStack_448 = 0;
          auStack_444[0]._0_4_ = 0;
          auStack_444[0]._4_4_ = 0;
          uStack_458 = 0;
          _local_454 = 0;
          local_450.s_addr = 0;
          local_44c = 0;
          local_478[8] = (uint8_t)uVar14;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&__begin13,"remote-as",(allocator<char> *)&__end13);
          pvVar9 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::at(&neighbor,(key_type *)&__begin13);
          uVar5 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::get_impl<unsigned_int,_0>(pvVar9);
          auStack_444[0] = CONCAT44(auStack_444[0]._4_4_,uVar5);
          std::__cxx11::string::~string((string *)&__begin13);
          local_478[9] = 2;
          local_454 = 2;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&__end13,"address",(allocator<char> *)&address);
          pvVar9 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::at(&neighbor,(key_type *)&__end13);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((key_type *)&__begin13,pvVar9);
          iVar4 = inet_aton((char *)__begin13.m_object,&local_450);
          std::__cxx11::string::~string((string *)&__begin13);
          std::__cxx11::string::~string((string *)&__end13);
          if (iVar4 == 0) {
            log<>(ERROR,"Invalid IP address in config");
            goto LAB_0010404b;
          }
          local_478._9_2_ = local_478._9_2_ & 0xff00;
          puVar12 = (undefined1 *)malloc(0x30);
          if (puVar12 == (undefined1 *)0x0) {
            log<>(ERROR,"Failed to allocate memory for adj_ribs_in root");
            goto LAB_0010404b;
          }
          *puVar12 = 0;
          *(undefined8 *)(puVar12 + 0x18) = 0;
          *(undefined8 *)(puVar12 + 0x20) = 0;
          *(undefined8 *)(puVar12 + 0x28) = 0;
          auStack_444[0] = auStack_444[0] & 0xffffffff;
          local_478._16_8_ = puVar12;
          std::vector<bgp_client_peer,_std::allocator<bgp_client_peer>_>::push_back
                    (&peers,(value_type *)local_478);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json(&neighbor);
          uVar14 = uVar14 + 1;
        }
        bVar2 = false;
        do {
          lVar13 = std::chrono::_V2::system_clock::now();
          iVar4 = getchar();
          if (console_mode == '\0') {
            iVar4 = iVar4 << 0x18;
            bVar3 = !bVar2;
            bVar2 = iVar4 != -0x1000000;
            if (iVar4 != -0x1000000 && bVar3) {
              bVar2 = true;
              if (iVar4 == 0x62000000) {
                raise(2);
              }
              else if (iVar4 == 0x63000000) {
                console_mode = '\x01';
                iVar4 = 1000;
                while (bVar3 = iVar4 != 0, iVar4 = iVar4 + -1, bVar3) {
                  getchar();
                }
                puts("Switched to command mode");
LAB_00103eb1:
                printf("> ");
              }
              else if (iVar4 == 0x71000000) {
                log<>(INFO,"Good bye");
                peer_00 = peers.
                          super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                pbVar17 = peers.
                          super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
LAB_00103fa3:
                for (; peer_00 != pbVar17; peer_00 = peer_00 + 1) {
                  close_client_peer(peer_00);
                }
                log<>(INFO,"Closed all peers");
                pbVar17 = peers.
                          super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                for (pbVar16 = peers.
                               super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>
                               ._M_impl.super__Vector_impl_data._M_start; pbVar16 != pbVar17;
                    pbVar16 = pbVar16 + 1) {
                  free((pbVar16->super_bgp_peer).adj_ribs_in);
                }
                delete_prefix<loc_rib_data>(bgp_loc_rib,false);
                puts("Safety exited");
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::~basic_json(&conf_json);
                std::ifstream::~ifstream(&conf_file);
                return 0;
              }
            }
          }
          else {
            if ((main::cmd_str_abi_cxx11_ == '\0') &&
               (iVar7 = __cxa_guard_acquire(&main::cmd_str_abi_cxx11_), iVar7 != 0)) {
              main::cmd_str_abi_cxx11_._M_dataplus._M_p = (pointer)&main::cmd_str_abi_cxx11_.field_2
              ;
              main::cmd_str_abi_cxx11_._M_string_length = 0;
              main::cmd_str_abi_cxx11_.field_2._M_local_buf[0] = '\0';
              __cxa_atexit(std::__cxx11::string::~string,&main::cmd_str_abi_cxx11_,&__dso_handle);
              __cxa_guard_release(&main::cmd_str_abi_cxx11_);
            }
            iVar4 = iVar4 << 0x18;
            if (iVar4 != -0x1000000) {
              if ((iVar4 >> 0x18) - 0x20U < 0x5f) {
                std::__cxx11::string::push_back('p');
              }
              else if (iVar4 == 0xa000000) {
                if (main::cmd_str_abi_cxx11_._M_string_length != 0) {
                  bVar3 = std::operator==(&main::cmd_str_abi_cxx11_,"exit");
                  if (bVar3) {
                    console_mode = '\0';
                    puts("Switched to log mode");
                  }
                  else {
                    bVar3 = std::operator==(&main::cmd_str_abi_cxx11_,"break");
                    if (bVar3) {
                      raise(2);
                    }
                    else {
                      bVar3 = std::operator==(&main::cmd_str_abi_cxx11_,"uptime");
                      if (bVar3) {
                        lVar15 = std::chrono::_V2::system_clock::now();
                        local_478._0_8_ = (lVar15 - lVar8) / 1000000000;
                        console<long>("Uptime %d seconds",(long *)local_478);
                      }
                      else {
                        bVar3 = std::operator==(&main::cmd_str_abi_cxx11_,"shutdown");
                        if (bVar3) {
                          console<>("Good bye");
                          peer_00 = peers.
                                    super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pbVar17 = peers.
                                    super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>
                                    ._M_impl.super__Vector_impl_data._M_finish;
                          goto LAB_00103fa3;
                        }
                        bVar3 = std::operator==(&main::cmd_str_abi_cxx11_,"test");
                        if (bVar3) {
                          for (uVar14 = 0;
                              uVar14 < (ulong)((long)peers.
                                                  super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)peers.
                                                  super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 6);
                              uVar14 = uVar14 + 1) {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)local_478,"networks",(allocator<char> *)&__begin13)
                            ;
                            pvVar9 = nlohmann::
                                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     ::at(&conf_json,(key_type *)local_478);
                            std::__cxx11::string::~string((string *)local_478);
                            nlohmann::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            ::begin(&__begin13,pvVar9);
                            nlohmann::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            ::end(&__end13,pvVar9);
                            while( true ) {
                              bVar3 = nlohmann::detail::
                                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      ::
                                      operator!=<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                                (&__begin13,&__end13);
                              if (!bVar3) break;
                              this = nlohmann::detail::
                                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                     ::operator*(&__begin13);
                              address.s_addr = 0;
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&neighbor,"prefix",&local_505);
                              pvVar9 = nlohmann::
                                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       ::at(this,(key_type *)&neighbor);
                              nlohmann::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              ::
                              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                        ((attributes *)local_478,pvVar9);
                              iVar4 = inet_aton((char *)local_478._0_8_,(in_addr *)&address);
                              std::__cxx11::string::~string((string *)local_478);
                              std::__cxx11::string::~string((string *)&neighbor);
                              if (iVar4 == 0) {
                                log<>(ERROR,"Invalid IP address in config");
                                goto LAB_0010404b;
                              }
                              memset(local_478 + 4,0,0x10c);
                              local_478._0_8_ = local_478._0_8_ & 0xffffffffffff0000;
                              local_374 = inet_addr("172.16.3.0");
                              prefix = address;
                              local_370._0_4_ = 100;
                              local_370._4_4_ = 0;
                              pbVar17 = peers.
                                        super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar14;
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&neighbor,"prefix-length",&local_505);
                              pvVar9 = nlohmann::
                                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       ::at(this,(key_type *)&neighbor);
                              prefix_len = nlohmann::
                                           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                           ::get_impl<unsigned_char,_0>(pvVar9);
                              send_update_with_nlri
                                        (&pbVar17->super_bgp_peer,(attributes *)local_478,
                                         prefix.s_addr,prefix_len);
                              std::__cxx11::string::~string((string *)&neighbor);
                              nlohmann::detail::
                              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ::operator++(&__begin13);
                            }
                          }
                        }
                        else {
                          cVar6 = execute_command(&main::cmd_str_abi_cxx11_);
                          format = "Invalid parameters";
                          if (cVar6 != INVALID_PARAMS) {
                            if (cVar6 != NOT_FOUND) goto LAB_00103e96;
                            format = "Command not found";
                          }
                          console<>(format);
                        }
                      }
                    }
                  }
                }
LAB_00103e96:
                main::cmd_str_abi_cxx11_._M_string_length = 0;
                *main::cmd_str_abi_cxx11_._M_dataplus._M_p = '\0';
                if (console_mode == '\x01') goto LAB_00103eb1;
              }
            }
          }
          lVar15 = 0;
          for (uVar14 = 0;
              uVar14 < (ulong)((long)peers.
                                     super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)peers.
                                     super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 6);
              uVar14 = uVar14 + 1) {
            log_id = (uint8_t)uVar14;
            bgp_client_loop((bgp_client_peer *)
                            (((peers.
                               super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>
                               ._M_impl.super__Vector_impl_data._M_start)->server_address).sin_zero
                            + lVar15 + -0x2c));
            lVar15 = lVar15 + 0x40;
          }
          log_id = 0xff;
          lVar15 = std::chrono::_V2::system_clock::now();
          uVar14 = (lVar15 - lVar13) / 1000;
          if (uVar14 < 100) {
            usleep(100 - (int)uVar14);
          }
        } while( true );
      }
      log<>(ERROR,"Failed to allocate memory for loc_rib root");
    }
  }
LAB_0010404b:
  exit(1);
}

Assistant:

int main(){
    std::chrono::system_clock::time_point up = std::chrono::system_clock::now();

    struct sigaction act, old_act;

    act.sa_handler = signal_handler;
    sigemptyset(&act.sa_mask);
    act.sa_flags = 0;
    act.sa_flags |= SA_INTERRUPT;

    if(sigaction(SIGALRM, &act, &old_act) < 0){
        fprintf(stderr, "Error registering signal disposition\n");
        exit(EXIT_FAILURE);
    }
    log_id = 0;
    log(log_level::INFO, "Hello BGP!!");
    fcntl(0, F_SETFL, O_NONBLOCK);

    std::ifstream conf_file(CONFIG_PATH, std::ios::in);
    if(!conf_file.is_open()){
        log(log_level::ERROR, "Failed to open config");
        exit(EXIT_FAILURE);
    }
    nlohmann::json conf_json;

    try{
        conf_file >> conf_json;
    }catch(nlohmann::detail::exception &e){
        log(log_level::ERROR, "Failed to load config");
        exit(EXIT_FAILURE);
    }
    conf_file.close();

    log(log_level::INFO, "Succeed to load config");

    my_as = conf_json.at("my_as").get<int>();
    log(log_level::INFO, "My AS: %d", my_as);

    router_id = inet_addr(conf_json.at("router-id").get<std::string>().c_str());
    log(log_level::INFO, "Router-ID: %s", inet_ntoa(in_addr{.s_addr = router_id}));

    bgp_loc_rib = (node<loc_rib_data>*) malloc(sizeof(node<loc_rib_data>));
    if(bgp_loc_rib == nullptr){
        log(log_level::ERROR, "Failed to allocate memory for loc_rib root");
        exit(EXIT_FAILURE);
    }
    bgp_loc_rib->is_prefix = false;
    bgp_loc_rib->prefix = 0;
    bgp_loc_rib->prefix_len = 0;
    bgp_loc_rib->data = nullptr;
    bgp_loc_rib->parent = nullptr;
    bgp_loc_rib->node_0 = nullptr;
    bgp_loc_rib->node_1 = nullptr;

    for(int i=0;i<conf_json.at("neighbors").size();i++){
        auto neighbor = conf_json.at("neighbors")[i];
        bgp_client_peer peer;
        peer.index = i;
        peer.sock = 0;
        peer.remote_as = neighbor.at("remote-as");
        peer.state = ACTIVE;
        peer.server_address.sin_family = AF_INET;

        if(inet_aton(neighbor.at("address").get<std::string>().c_str(), &peer.server_address.sin_addr) == 0){
            log(log_level::ERROR, "Invalid IP address in config");
            exit(EXIT_FAILURE);
        }
        peer.state = IDLE;

        auto* root = (node<adj_ribs_in_data>*) malloc(sizeof(node<adj_ribs_in_data>));
        if(root == nullptr){
            log(log_level::ERROR, "Failed to allocate memory for adj_ribs_in root");
            exit(EXIT_FAILURE);
        }
        root->is_prefix = false;
        root->parent = nullptr;
        root->node_0 = nullptr;
        root->node_1 = nullptr;
        peer.adj_ribs_in = root;
        peer.connect_cool_loop_time = 0;
        peers.push_back(peer); // これ、よく見るとブロック抜けたらpeerのメモリ解放されそうだけど、今のところこれで問題が起きたことがないのはなぜだろう
    }

    std::chrono::system_clock::time_point start, now;
    uint64_t real_time;
    bool is_input_continuous = false; // ログモードの時に長いテキストを間違えてペーストしてその中にcやbが含まれていると止まってしまうので、連続で入力された場合は無視するために前回のループで入力があったかを保持する
    while(true){
        start = std::chrono::system_clock::now();
        char input = getchar(); // TODO charの範囲外かもしれない
        if(console_mode == 0){
            if(input == -1){
                is_input_continuous = false;
            }else{
                if(!is_input_continuous){
                    if(input == 'q'){ // TODO ログモードからのプログラム終了は廃止したい
                        log(log_level::INFO, "Good bye");
                        break;
                    }else if(input == 'b'){
                        raise(SIGINT);
                    }else if(input == 'c'){
                        console_mode = 1;
                        for(int i = 0; i < 1000; ++i){
                            getchar(); // 連続入力の対策はしているが、もしかすると連続する文字列がcから始まるかもしれない. その場合、対策をすり抜けてしまうのでへんなコマンドが実行されないようにここでバッファをクリアする
                        }
                        printf("Switched to command mode\n");
                        printf("> ");
                    }
                }
                is_input_continuous = true;
            }
        }else{
            static std::string cmd_str;
            if(input != -1){
                if(input >= 0x20 and input <= 0x7e){
                    cmd_str.push_back(input);
                }else if(input == 0x0a){
                    if(cmd_str.empty()){
                    }else if(cmd_str == "exit"){
                        console_mode = 0;
                        printf("Switched to log mode\n");
                    }else if(cmd_str == "break"){
                        raise(SIGINT);
                    }else if(cmd_str == "uptime"){
                        now = std::chrono::system_clock::now();
                        console("Uptime %d seconds", std::chrono::duration_cast<std::chrono::seconds>(now-up).count());
                    }else if(cmd_str == "shutdown"){
                        console("Good bye");
                        break;
                    }else if(cmd_str == "test"){
                        for(int i = 0; i < peers.size(); ++i){
                            for(auto &network: conf_json.at("networks")){
                                in_addr address = {};
                                if(inet_aton(network.at("prefix").get<std::string>().c_str(), &address) == 0){
                                    log(log_level::ERROR, "Invalid IP address in config");
                                    exit(EXIT_FAILURE);
                                }
                                attributes a;
                                a.origin = IGP;
                                a.as_path_length = 0;
                                a.next_hop = inet_addr("172.16.3.0");
                                a.med = 100;
                                a.local_pref = 0;
                                send_update_with_nlri(&peers[i], &a, address.s_addr, network.at("prefix-length"));
                            }
                        }
                    }else{
                        command_result_status command_result = execute_command(cmd_str);
                        if(command_result == command_result_status::NOT_FOUND){
                            console("Command not found");
                        }else if(command_result == command_result_status::INVALID_PARAMS){
                            console("Invalid parameters");
                        }
                    }
                    cmd_str.clear();
                    if(console_mode == 1){ // Exitされていないなら
                        printf("> ");
                    }
                }
            }
        }

        for(int i = 0; i < peers.size(); ++i){
            log_id = i;
            if(!bgp_client_loop(&peers[i])){
            }
        }
        log_id = 0xff;

        now = std::chrono::system_clock::now();
        real_time = std::chrono::duration_cast<std::chrono::microseconds>(now-start).count();
        if(LOOP_MINIMUM_US > real_time){ // もしこのループにかかった時間がLOOP_MINIMUM_US未満なら
            usleep(LOOP_MINIMUM_US - real_time); //　LOOP_MINIMUM_USに満たない時間分ループが終わるのを待つ
        }
    }

    for(auto & peer : peers){
        close_client_peer(&peer);
    }
    log(log_level::INFO, "Closed all peers");

    for(auto & peer : peers){
        free(peer.adj_ribs_in); // root自体はまだ解放されていないのでここで
    }
    delete_prefix(bgp_loc_rib);
    printf("Safety exited\n");
    return EXIT_SUCCESS;
}